

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut.c
# Opt level: O2

int Sbd_StoPrepareSet(Sbd_Sto_t *p,int iObj,int Index)

{
  Sbd_Cut_t *pCut;
  int *piVar1;
  int iVar2;
  uint uVar3;
  Vec_Int_t *pVVar4;
  long lVar5;
  word wVar6;
  long lVar7;
  int *piVar8;
  int *piVar9;
  
  pVVar4 = Vec_WecEntry(p->vCuts,iObj);
  piVar1 = pVVar4->pArray;
  piVar9 = piVar1 + 1;
  piVar8 = p->pCuts[(uint)Index][0].pLeaves;
  for (lVar7 = 0; iVar2 = *piVar1, lVar7 < iVar2; lVar7 = lVar7 + 1) {
    pCut = p->pCuts[(uint)Index] + lVar7;
    *(uint *)&p->pCuts[(uint)Index][lVar7].field_0x14 =
         *(uint *)&p->pCuts[(uint)Index][lVar7].field_0x14 & 0xfffffff | *piVar9 << 0x1c;
    lVar5 = 0;
    while( true ) {
      if ((long)*piVar9 < lVar5 + 1) break;
      piVar8[lVar5] = piVar9[lVar5 + 1];
      lVar5 = lVar5 + 1;
    }
    pCut->iFunc = piVar9[(long)*piVar9 + 1];
    wVar6 = Sbd_CutGetSign(pCut);
    pCut->Sign = wVar6;
    iVar2 = Sbd_CutCost(p,pCut);
    pCut->Cost = iVar2;
    iVar2 = Sbd_CutCostLev(p,pCut);
    pCut->CostLev = iVar2;
    uVar3 = Sbd_CutTreeLeaves(p,pCut);
    *(uint *)&pCut->field_0x14 = *(uint *)&pCut->field_0x14 & 0xfffffe00 | uVar3 & 0x1ff;
    uVar3 = Sbd_CutSlowLeaves(p,iObj,pCut);
    *(uint *)&pCut->field_0x14 = *(uint *)&pCut->field_0x14 & 0xfffc01ff | (uVar3 & 0x1ff) << 9;
    uVar3 = Sbd_CutTopLeaves(p,iObj,pCut);
    *(uint *)&pCut->field_0x14 = *(uint *)&pCut->field_0x14 & 0xf003ffff | (uVar3 & 0x3ff) << 0x12;
    piVar9 = piVar9 + (long)*piVar9 + 2;
    piVar8 = piVar8 + 0x10;
  }
  return iVar2;
}

Assistant:

static inline int Sbd_StoPrepareSet( Sbd_Sto_t * p, int iObj, int Index )
{
    Vec_Int_t * vThis = Vec_WecEntry( p->vCuts, iObj );
    int i, v, * pCut, * pList = Vec_IntArray( vThis );
    Sbd_ForEachCut( pList, pCut, i )
    {
        Sbd_Cut_t * pCutTemp = &p->pCuts[Index][i];
        pCutTemp->nLeaves = pCut[0];
        for ( v = 1; v <= pCut[0]; v++ )
            pCutTemp->pLeaves[v-1] = pCut[v];
        pCutTemp->iFunc = pCut[pCut[0]+1];
        pCutTemp->Sign = Sbd_CutGetSign( pCutTemp );
        pCutTemp->Cost = Sbd_CutCost( p, pCutTemp );
        pCutTemp->CostLev = Sbd_CutCostLev( p, pCutTemp );
        pCutTemp->nTreeLeaves = Sbd_CutTreeLeaves( p, pCutTemp );
        pCutTemp->nSlowLeaves = Sbd_CutSlowLeaves( p, iObj, pCutTemp );
        pCutTemp->nTopLeaves  = Sbd_CutTopLeaves( p, iObj, pCutTemp );
    }
    return pList[0];
}